

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O1

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::GetForTarget
          (FunctionCodeGenRuntimeData *this,FunctionBody *targetFuncBody)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  do {
    if ((this->functionBody).ptr == targetFuncBody) {
      return this;
    }
    this = (this->next).ptr;
  } while (this != (FunctionCodeGenRuntimeData *)0x0);
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                              ,0x26,"(target)","target");
  if (bVar2) {
    *puVar3 = 0;
    return (FunctionCodeGenRuntimeData *)0x0;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

const FunctionCodeGenRuntimeData * FunctionCodeGenRuntimeData::GetForTarget(FunctionBody *targetFuncBody) const
    {
        const FunctionCodeGenRuntimeData * target = this;
        while (target && target->GetFunctionBody() != targetFuncBody)
        {
            target = target->next;
        }
        // we should always find the info
        Assert(target);
        return target;
    }